

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::RuleCharacterIterator::_current(RuleCharacterIterator *this)

{
  int32_t offset;
  int32_t iVar1;
  UChar32 local_30;
  int i;
  RuleCharacterIterator *this_local;
  
  if (this->buf == (UnicodeString *)0x0) {
    offset = ParsePosition::getIndex(this->pos);
    iVar1 = UnicodeString::length(this->text);
    if (offset < iVar1) {
      local_30 = UnicodeString::char32At(this->text,offset);
    }
    else {
      local_30 = -1;
    }
    this_local._4_4_ = local_30;
  }
  else {
    this_local._4_4_ = UnicodeString::char32At(this->buf,this->bufPos);
  }
  return this_local._4_4_;
}

Assistant:

UChar32 RuleCharacterIterator::_current() const {
    if (buf != 0) {
        return buf->char32At(bufPos);
    } else {
        int i = pos.getIndex();
        return (i < text.length()) ? text.char32At(i) : (UChar32)DONE;
    }
}